

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::deleteRows(Highs *this,HighsInt num_set_entries,HighsInt *set)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  string method;
  HighsInt HVar1;
  HighsStatus HVar2;
  HighsIndexCollection index_collection;
  undefined1 in_stack_fffffffffffffeec [12];
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 local_f8 [16];
  HighsLogOptions local_e8;
  HighsIndexCollection local_80;
  
  if (num_set_entries == 0) {
    HVar2 = kOk;
  }
  else {
    clearDerivedModelProperties(this);
    local_80.dimension_ = -1;
    local_80.is_interval_ = false;
    local_80.from_ = -1;
    local_80.to_ = -2;
    local_80.is_set_ = false;
    local_80.set_num_entries_ = -1;
    local_80.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_80.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_80.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_80.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_80.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    local_80.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._1_7_ = 0;
    local_80.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    local_80._41_8_ = 0;
    HVar1 = create(&local_80,num_set_entries,set,(this->model_).lp_.num_row_);
    if (HVar1 == 0) {
      deleteRowsInterface(this,&local_80);
      HVar2 = returnFromHighs(this,kOk);
    }
    else {
      local_e8.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
      local_e8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_e8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_e8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_e8.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_e8.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      this_00 = &local_e8.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
      local_e8.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_e8.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      puVar3 = local_f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffef8,"deleteRows","");
      method._4_12_ = in_stack_fffffffffffffeec;
      method._M_dataplus._M_p._0_4_ = (this->model_).lp_.num_row_;
      method.field_2._M_allocated_capacity = (size_type)puVar3;
      method.field_2._8_8_ = in_stack_ffffffffffffff00;
      analyseSetCreateError
                (&local_e8,method,(HighsInt)puVar3,SUB41(HVar1,0),0,
                 (HighsInt *)(ulong)(uint)num_set_entries,(HighsInt)set);
      if (puVar3 != local_f8) {
        operator_delete(puVar3);
      }
      HVar2 = kError;
      if (local_e8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_e8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
    }
    if (local_80.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_80.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_80.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_80.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::deleteRows(const HighsInt num_set_entries,
                              const HighsInt* set) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, num_set_entries, set, model_.lp_.num_row_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "deleteRows",
                                 create_error, false, num_set_entries, set,
                                 model_.lp_.num_row_);
  deleteRowsInterface(index_collection);
  return returnFromHighs(HighsStatus::kOk);
}